

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O3

int run_test_udp_options6(void)

{
  ushort uVar1;
  int iVar2;
  ushort *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  long *plVar6;
  bool bVar7;
  int64_t eval_a;
  int64_t eval_b;
  sockaddr_in6 addr;
  long lStack_1c0;
  long lStack_1b8;
  long alStack_1b0 [23];
  undefined1 auStack_f8 [184];
  code *pcStack_40;
  long local_38 [2];
  sockaddr local_28 [2];
  
  pcStack_40 = (code *)0x1e049f;
  iVar2 = uv_interface_addresses(local_28,local_38);
  if (iVar2 != 0) {
LAB_001e0529:
    pcStack_40 = (code *)0x1e052e;
    run_test_udp_options6_cold_1();
    return 7;
  }
  if ((long)(int)local_38[0] < 1) {
    pcStack_40 = (code *)0x1e0529;
    uv_free_interface_addresses();
    goto LAB_001e0529;
  }
  puVar3 = (ushort *)(local_28[0]._0_8_ + 0x14);
  uVar5 = 1;
  do {
    uVar1 = *puVar3;
    if (uVar1 == 10) break;
    puVar3 = puVar3 + 0x30;
    bVar7 = uVar5 < (ulong)(long)(int)local_38[0];
    uVar5 = uVar5 + 1;
  } while (bVar7);
  pcStack_40 = (code *)0x1e04dc;
  uv_free_interface_addresses();
  if (uVar1 != 10) goto LAB_001e0529;
  pcStack_40 = (code *)0x1e04f8;
  iVar2 = uv_ip6_addr("::",0x23a3,local_28);
  local_38[0] = (long)iVar2;
  local_38[1] = 0;
  if (local_38[0] == 0) {
    pcStack_40 = (code *)0x1e051c;
    udp_options_test(local_28);
    return 0;
  }
  pcStack_40 = run_test_udp_no_autobind;
  run_test_udp_options6_cold_2();
  plVar6 = &lStack_1c0;
  pcStack_40 = (code *)(ulong)uVar1;
  uVar4 = uv_default_loop();
  iVar2 = uv_udp_init(uVar4,auStack_f8);
  alStack_1b0[0] = (long)iVar2;
  lStack_1c0 = 0;
  if (alStack_1b0[0] == 0) {
    alStack_1b0[0] = -9;
    iVar2 = uv_udp_set_multicast_ttl(auStack_f8,0x20);
    lStack_1c0 = (long)iVar2;
    if (alStack_1b0[0] != lStack_1c0) goto LAB_001e0826;
    alStack_1b0[0] = -9;
    iVar2 = uv_udp_set_broadcast(auStack_f8,1);
    lStack_1c0 = (long)iVar2;
    if (alStack_1b0[0] != lStack_1c0) goto LAB_001e0833;
    alStack_1b0[0] = -9;
    iVar2 = uv_udp_set_ttl(auStack_f8,1);
    lStack_1c0 = (long)iVar2;
    if (alStack_1b0[0] != lStack_1c0) goto LAB_001e0840;
    alStack_1b0[0] = -9;
    iVar2 = uv_udp_set_multicast_loop(auStack_f8,1);
    lStack_1c0 = (long)iVar2;
    if (alStack_1b0[0] != lStack_1c0) goto LAB_001e084d;
    alStack_1b0[0] = -9;
    iVar2 = uv_udp_set_multicast_interface(auStack_f8,"0.0.0.0");
    lStack_1c0 = (long)iVar2;
    if (alStack_1b0[0] != lStack_1c0) goto LAB_001e085a;
    uv_close(auStack_f8,0);
    iVar2 = uv_udp_init_ex(uVar4,alStack_1b0,0x102);
    lStack_1c0 = (long)iVar2;
    lStack_1b8 = 0;
    if (lStack_1c0 != 0) goto LAB_001e0867;
    iVar2 = uv_udp_set_multicast_ttl(alStack_1b0,0x20);
    lStack_1c0 = (long)iVar2;
    lStack_1b8 = 0;
    if (lStack_1c0 != 0) goto LAB_001e0874;
    iVar2 = uv_udp_set_broadcast(alStack_1b0,1);
    lStack_1c0 = (long)iVar2;
    lStack_1b8 = 0;
    if (lStack_1c0 != 0) goto LAB_001e0881;
    iVar2 = uv_udp_set_ttl(alStack_1b0,1);
    lStack_1c0 = (long)iVar2;
    lStack_1b8 = 0;
    if (lStack_1c0 != 0) goto LAB_001e088e;
    iVar2 = uv_udp_set_multicast_loop(alStack_1b0,1);
    lStack_1c0 = (long)iVar2;
    lStack_1b8 = 0;
    if (lStack_1c0 != 0) goto LAB_001e089b;
    iVar2 = uv_udp_set_multicast_interface(alStack_1b0,"0.0.0.0");
    lStack_1c0 = (long)iVar2;
    lStack_1b8 = 0;
    if (lStack_1c0 != 0) goto LAB_001e08a8;
    uv_close(alStack_1b0,0);
    iVar2 = uv_run(uVar4,0);
    lStack_1c0 = (long)iVar2;
    lStack_1b8 = 0;
    if (lStack_1c0 == 0) {
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      lStack_1c0 = 0;
      iVar2 = uv_loop_close(uVar4);
      lStack_1b8 = (long)iVar2;
      if (lStack_1c0 == lStack_1b8) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001e08c2;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_001e0826:
    run_test_udp_no_autobind_cold_2();
LAB_001e0833:
    run_test_udp_no_autobind_cold_3();
LAB_001e0840:
    run_test_udp_no_autobind_cold_4();
LAB_001e084d:
    run_test_udp_no_autobind_cold_5();
LAB_001e085a:
    run_test_udp_no_autobind_cold_6();
LAB_001e0867:
    run_test_udp_no_autobind_cold_7();
LAB_001e0874:
    run_test_udp_no_autobind_cold_8();
LAB_001e0881:
    run_test_udp_no_autobind_cold_9();
LAB_001e088e:
    run_test_udp_no_autobind_cold_10();
LAB_001e089b:
    run_test_udp_no_autobind_cold_11();
LAB_001e08a8:
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_001e08c2:
  run_test_udp_no_autobind_cold_14();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(plVar6,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

TEST_IMPL(udp_options6) {
  struct sockaddr_in6 addr;

  if (!can_ipv6())
    RETURN_SKIP("IPv6 not supported");

  ASSERT_OK(uv_ip6_addr("::", TEST_PORT, &addr));
  return udp_options_test((const struct sockaddr*) &addr);
}